

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Init.cpp
# Opt level: O2

void Handlers::Init_Init(EOClient *client,PacketReader *reader)

{
  EOServer *pEVar1;
  byte bVar2;
  uchar uVar3;
  bool bVar4;
  bool bVar5;
  pair<unsigned_char,_unsigned_char> pVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  mapped_type *pmVar10;
  time_t tVar11;
  int iVar12;
  int iVar13;
  _List_node_base *p_Var14;
  list<Client_*,_std::allocator<Client_*>_> *plVar15;
  int *hdid;
  double dVar16;
  allocator<char> local_d1;
  IPAddress remote_addr;
  char errbuf [64];
  PacketBuilder reply;
  string hdid_str;
  
  PacketBuilder::PacketBuilder(&reply,PACKET_F_INIT,PACKET_A_INIT,10);
  uVar7 = PacketReader::GetThree(reader);
  PacketReader::GetChar(reader);
  PacketReader::GetChar(reader);
  bVar2 = PacketReader::GetChar(reader);
  client->version = (uint)bVar2;
  uVar3 = PacketReader::GetChar(reader);
  bVar2 = PacketReader::GetChar(reader);
  PacketReader::GetEndString_abi_cxx11_(&hdid_str,reader);
  uVar8 = util::to_uint_raw(&hdid_str);
  client->hdid = uVar8;
  pEVar1 = (EOServer *)(client->super_Client).server;
  if (hdid_str._M_string_length == bVar2) {
    plVar15 = &(pEVar1->super_Server).clients;
    iVar12 = 0;
    p_Var14 = (_List_node_base *)plVar15;
    while (p_Var14 = (((_List_base<Client_*,_std::allocator<Client_*>_> *)&p_Var14->_M_next)->
                     _M_impl)._M_node.super__List_node_base._M_next,
          p_Var14 != (_List_node_base *)plVar15) {
      if (*(int *)&((Client *)p_Var14[1]._M_next)[1].send_buffer.field_2 == client->hdid) {
        errbuf._0_4_ = Client::GetRemoteAddr((Client *)p_Var14[1]._M_next);
        remote_addr = Client::GetRemoteAddr(&client->super_Client);
        bVar4 = IPAddress::operator==((IPAddress *)errbuf,&remote_addr);
        iVar12 = iVar12 + (uint)bVar4;
      }
    }
    p_Var14 = (client->super_Client).server[1].clients.
              super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl._M_node.
              super__List_node_base._M_prev;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)errbuf,"IgnoreHDID",(allocator<char> *)&remote_addr);
    pmVar10 = std::__detail::
              _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
              ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                            *)&p_Var14[0x19]._M_prev,(key_type *)errbuf);
    bVar4 = util::variant::GetBool(pmVar10);
    std::__cxx11::string::~string((string *)errbuf);
    if (!bVar4) {
      p_Var14 = (client->super_Client).server[1].clients.
                super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl._M_node.
                super__List_node_base._M_prev;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)errbuf,"MaxConnectionsPerPC",(allocator<char> *)&remote_addr);
      pmVar10 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&p_Var14[0x19]._M_prev,(key_type *)errbuf);
      iVar9 = util::variant::GetInt(pmVar10);
      std::__cxx11::string::~string((string *)errbuf);
      if ((iVar9 != 0) && (iVar9 < iVar12)) {
        snprintf(errbuf,0x40,"too many connections from this PC: %08x",(ulong)(uint)client->hdid);
        pEVar1 = (EOServer *)(client->super_Client).server;
        remote_addr = Client::GetRemoteAddr(&client->super_Client);
        EOServer::RecordClientRejection(pEVar1,&remote_addr,errbuf);
        Client::Close(&client->super_Client,true);
        goto LAB_0014a04d;
      }
    }
    remote_addr = Client::GetRemoteAddr(&client->super_Client);
    hdid = &client->hdid;
    if (bVar4) {
      hdid = (int *)0x0;
    }
    iVar12 = World::CheckBan((World *)(client->super_Client).server[1].clients.
                                      super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl.
                                      _M_node.super__List_node_base._M_prev,(string *)0x0,
                             &remote_addr,hdid);
    if (iVar12 == -1) {
      p_Var14 = (client->super_Client).server[1].clients.
                super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl._M_node.
                super__List_node_base._M_prev;
      std::__cxx11::string::string<std::allocator<char>>((string *)errbuf,"MinVersion",&local_d1);
      pmVar10 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&p_Var14[0x19]._M_prev,(key_type *)errbuf);
      iVar12 = util::variant::GetInt(pmVar10);
      std::__cxx11::string::~string((string *)errbuf);
      if (iVar12 == 0) {
        p_Var14 = (client->super_Client).server[1].clients.
                  super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl._M_node.
                  super__List_node_base._M_prev;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)errbuf,"OldVersionCompat",&local_d1);
        pmVar10 = std::__detail::
                  _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                  ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                *)&p_Var14[0x19]._M_prev,(key_type *)errbuf);
        bVar4 = util::variant::GetBool(pmVar10);
        iVar12 = 0x1c - (uint)bVar4;
        std::__cxx11::string::~string((string *)errbuf);
      }
      p_Var14 = (client->super_Client).server[1].clients.
                super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl._M_node.
                super__List_node_base._M_prev;
      std::__cxx11::string::string<std::allocator<char>>((string *)errbuf,"MaxVersion",&local_d1);
      pmVar10 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&p_Var14[0x19]._M_prev,(key_type *)errbuf);
      iVar9 = util::variant::GetInt(pmVar10);
      std::__cxx11::string::~string((string *)errbuf);
      if (client->version < iVar12) {
        bVar4 = false;
      }
      else {
        iVar13 = 0x1c;
        if (iVar9 != 0) {
          iVar13 = iVar9;
        }
        bVar4 = client->version <= iVar13 || iVar13 < 0;
      }
      p_Var14 = (client->super_Client).server[1].clients.
                super__List_base<Client_*,_std::allocator<Client_*>_>._M_impl._M_node.
                super__List_node_base._M_prev;
      std::__cxx11::string::string<std::allocator<char>>((string *)errbuf,"CheckVersion",&local_d1);
      pmVar10 = std::__detail::
                _Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                ::operator[]((_Map_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_util::variant>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                              *)&p_Var14[0x19]._M_prev,(key_type *)errbuf);
      bVar5 = util::variant::GetBool(pmVar10);
      std::__cxx11::string::~string((string *)errbuf);
      if ((bVar5 & (bVar4 ^ 1U | uVar3 != 'p')) == 1) {
        pEVar1 = (EOServer *)(client->super_Client).server;
        errbuf._0_4_ = Client::GetRemoteAddr(&client->super_Client);
        EOServer::RecordClientRejection(pEVar1,(IPAddress *)errbuf,"out of date");
        PacketBuilder::AddByte(&reply,'\x01');
        PacketBuilder::AddChar(&reply,0);
        PacketBuilder::AddChar(&reply,0);
        PacketBuilder::AddChar(&reply,iVar12);
        EOClient::Send(client,&reply);
        Client::Close(&client->super_Client,false);
      }
      else {
        uVar8 = uVar7 + 1;
        iVar12 = util::rand();
        iVar9 = util::rand();
        EOClient::InitNewSequence(client);
        pVar6 = EOClient::GetSeqInitBytes(client);
        PacketBuilder::AddByte(&reply,'\x02');
        PacketBuilder::AddByte(&reply,pVar6.first);
        PacketBuilder::AddByte(&reply,pVar6.second);
        PacketBuilder::AddByte(&reply,(uchar)iVar12);
        PacketBuilder::AddByte(&reply,(uchar)iVar9);
        PacketBuilder::AddShort(&reply,client->id);
        PacketBuilder::AddThree
                  (&reply,uVar8 % 0x7d4 +
                          ((0xa94023 - uVar7) % ((uVar8 % 0xb) * 0x77 + 0x77)) *
                          ((uVar8 % 9) * 0x77 + 0x77) + 0x1b139);
        PacketProcessor::SetEMulti(&client->processor,(uchar)iVar12,(uchar)iVar9);
        EOClient::Send(client,&reply);
        client->state = Initialized;
      }
    }
    else {
      PacketBuilder::AddByte(&reply,'\x03');
      pEVar1 = (EOServer *)(client->super_Client).server;
      if (iVar12 == 0) {
        errbuf._0_4_ = Client::GetRemoteAddr(&client->super_Client);
        EOServer::RecordClientRejection(pEVar1,(IPAddress *)errbuf,"perm ban");
        PacketBuilder::AddByte(&reply,'\x02');
      }
      else {
        errbuf._0_4_ = Client::GetRemoteAddr(&client->super_Client);
        EOServer::RecordClientRejection(pEVar1,(IPAddress *)errbuf,"temp ban");
        tVar11 = time((time_t *)0x0);
        PacketBuilder::AddByte(&reply,'\0');
        dVar16 = ceil((double)(iVar12 - tVar11) / 60.0);
        if (255.0 <= dVar16) {
          dVar16 = 255.0;
        }
        PacketBuilder::AddByte(&reply,(uchar)(int)dVar16);
      }
      EOClient::Send(client,&reply);
      Client::Close(&client->super_Client,false);
    }
  }
  else {
    errbuf._0_4_ = Client::GetRemoteAddr(&client->super_Client);
    EOServer::RecordClientRejection(pEVar1,(IPAddress *)errbuf,"bad hdid");
    Client::Close(&client->super_Client,true);
  }
LAB_0014a04d:
  std::__cxx11::string::~string((string *)&hdid_str);
  PacketBuilder::~PacketBuilder(&reply);
  return;
}

Assistant:

void Init_Init(EOClient *client, PacketReader &reader)
{
	PacketBuilder reply(PACKET_F_INIT, PACKET_A_INIT, 10);

	unsigned int challenge;
	unsigned int response;

	challenge = reader.GetThree();

	reader.GetChar(); // ?
	reader.GetChar(); // ?
	client->version = reader.GetChar();
	unsigned prot = reader.GetChar();
	unsigned hdid_len = reader.GetChar();
	std::string hdid_str = reader.GetEndString();

	try
	{
		client->hdid = int(util::to_uint_raw(hdid_str));
	}
	catch (std::invalid_argument&)
	{
		client->server()->RecordClientRejection(client->GetRemoteAddr(), "bad hdid");
		client->Close(true);
		return;
	}

	if (hdid_str.length() != hdid_len)
	{
		client->server()->RecordClientRejection(client->GetRemoteAddr(), "bad hdid");
		client->Close(true);
		return;
	}

	int pc_connections = 0;

	UTIL_FOREACH(client->server()->clients, checkclient)
	{
		EOClient *checkeoclient = static_cast<EOClient *>(checkclient);

		if (checkeoclient->hdid == client->hdid && checkeoclient->GetRemoteAddr() == client->GetRemoteAddr())
		{
			++pc_connections;
		}
	}

	const bool ignore_hdid = client->server()->world->config["IgnoreHDID"];

	if (!ignore_hdid)
	{
		const int max_per_pc = int(client->server()->world->config["MaxConnectionsPerPC"]);

		if (max_per_pc != 0 && pc_connections > max_per_pc)
		{
			char errbuf[64];
			std::snprintf(errbuf, sizeof errbuf, "too many connections from this PC: %08x", client->hdid);
			client->server()->RecordClientRejection(client->GetRemoteAddr(), errbuf);
			client->Close(true);
			return;
		}
	}

	int ban_expires;
	IPAddress remote_addr = client->GetRemoteAddr();
	if ((ban_expires = client->server()->world->CheckBan(0, &remote_addr, ignore_hdid ? 0 : &client->hdid)) != -1)
	{
		reply.AddByte(INIT_BANNED);
		if (ban_expires == 0)
		{
			client->server()->RecordClientRejection(client->GetRemoteAddr(), "perm ban");
			reply.AddByte(INIT_BAN_PERM);
		}
		else
		{
			client->server()->RecordClientRejection(client->GetRemoteAddr(), "temp ban");
			int mins_remaining = int(std::min(255.0, std::ceil(double(ban_expires - std::time(0)) / 60.0)));
			reply.AddByte(INIT_BAN_TEMP);
			reply.AddByte(mins_remaining);
		}
		client->Send(reply);
		client->Close();
		return;
	}

	int minversion = client->server()->world->config["MinVersion"];
	if (!minversion)
	{
		minversion = client->server()->world->config["OldVersionCompat"] ? 27 : 28;
	}

	int maxversion = client->server()->world->config["MaxVersion"];
	if (!maxversion)
	{
		maxversion = 28;
	}

	bool accepted_version = client->version >= minversion && (maxversion < 0 || client->version <= maxversion);

	if (prot != 112)
		accepted_version = false;

	if (client->server()->world->config["CheckVersion"] && !accepted_version)
	{
		client->server()->RecordClientRejection(client->GetRemoteAddr(), "out of date");
		reply.AddByte(INIT_OUT_OF_DATE);
		reply.AddChar(0);
		reply.AddChar(0);
		reply.AddChar(minversion);
		client->Send(reply);
		client->Close();
		return;
	}

	response = stupid_hash(challenge);

	int emulti_e = util::rand(6,12);
	int emulti_d = util::rand(6,12);

	client->InitNewSequence();
	auto seq_bytes = client->GetSeqInitBytes();

	reply.AddByte(INIT_OK);
	reply.AddByte(seq_bytes.first);
	reply.AddByte(seq_bytes.second);
	reply.AddByte(emulti_e);
	reply.AddByte(emulti_d);
	reply.AddShort(client->id);
	reply.AddThree(response);

	client->processor.SetEMulti(emulti_e, emulti_d);

	client->Send(reply);

	client->state = EOClient::Initialized;

	return;
}